

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  path *__return_storage_ptr__;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference this_00;
  string_type *psVar4;
  bool local_1b4;
  bool local_1b1;
  iterator local_1a8;
  iterator local_160;
  byte local_111;
  undefined1 local_110 [7];
  bool first;
  iterator iter;
  bool local_a1;
  path local_a0;
  byte local_79;
  path local_78;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  path *p_local;
  path *this_local;
  
  local_20 = &p->_path;
  p_local = this;
  bVar1 = empty(p);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      return this;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == '/') {
      return this;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == ':') {
      return this;
    }
    std::__cxx11::string::operator+=((string *)this,'/');
    return this;
  }
  bVar1 = is_absolute((path *)local_20);
  local_41 = 0;
  local_79 = 0;
  local_a1 = false;
  if (bVar1) {
    root_name((path *)&local_40,this);
    local_41 = 1;
    bVar1 = std::operator!=(&this->_path,&local_40);
    local_1b1 = true;
    if (bVar1) goto LAB_002a7da5;
    bVar1 = std::operator!=(local_20,"/");
    local_1b1 = true;
    if (bVar1) goto LAB_002a7da5;
  }
  local_a1 = has_root_name((path *)local_20);
  local_1b4 = false;
  if (local_a1) {
    root_name(&local_78,(path *)local_20);
    local_79 = 1;
    root_name(&local_a0,this);
    local_1b4 = filesystem::operator!=(&local_78,&local_a0);
  }
  local_1b1 = local_1b4;
LAB_002a7da5:
  if (local_a1 != false) {
    ~path(&local_a0);
  }
  if ((local_79 & 1) != 0) {
    ~path(&local_78);
  }
  if ((local_41 & 1) != 0) {
    ~path((path *)&local_40);
  }
  this_local = this;
  if (local_1b1 == false) {
    bVar1 = has_root_directory((path *)local_20);
    if (bVar1) {
      __return_storage_ptr__ = (path *)((long)&iter._current._path.field_2 + 8);
      root_name(__return_storage_ptr__,this);
      assign<ghc::filesystem::path>(this,__return_storage_ptr__);
      ~path((path *)((long)&iter._current._path.field_2 + 8));
    }
    else {
      bVar1 = has_root_directory(this);
      if (((!bVar1) && (bVar1 = is_absolute(this), bVar1)) || (bVar1 = has_filename(this), bVar1)) {
        std::__cxx11::string::operator+=((string *)this,'/');
      }
    }
    begin((iterator *)local_110,(path *)local_20);
    local_111 = 1;
    bVar1 = has_root_name((path *)local_20);
    if (bVar1) {
      iterator::operator++((iterator *)local_110);
    }
    while( true ) {
      end(&local_160,(path *)local_20);
      bVar1 = iterator::operator!=((iterator *)local_110,&local_160);
      iterator::~iterator(&local_160);
      if (!bVar1) break;
      if ((local_111 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::length();
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
          if (*pcVar3 == '/') goto LAB_002a8027;
        }
        std::__cxx11::string::operator+=((string *)this,'/');
      }
LAB_002a8027:
      local_111 = 0;
      iterator::operator++(&local_1a8,(iterator *)local_110,0);
      this_00 = iterator::operator*(&local_1a8);
      psVar4 = native_abi_cxx11_(this_00);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar4);
      iterator::~iterator(&local_1a8);
    }
    check_long_path(this);
    iterator::~iterator((iterator *)local_110);
  }
  else {
    assign<ghc::filesystem::path>(this,(path *)local_20);
  }
  return this_local;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}